

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  string *psVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Json *pJVar4;
  Value *pVVar5;
  char *value_00;
  LargestUInt value_01;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  LargestInt value_02;
  char *pcVar6;
  ArrayIndex index;
  pointer pbVar7;
  double value_03;
  Members members;
  string local_68;
  Members local_48;
  
  switch(value->field_0x8) {
  case 0:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    goto LAB_001125ff;
  case 1:
    pJVar4 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar4,value_02);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 2:
    pJVar4 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar4,value_01);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 3:
    value_03 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)value,value_03);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 4:
    pJVar4 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&local_68,pJVar4,value_00);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 5:
    bVar2 = Value::asBool(value);
    pcVar6 = "false";
    if (bVar2) {
      pcVar6 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar6,pcVar6 + ((ulong)bVar2 ^ 5));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00112530;
  case 6:
    std::__cxx11::string::append((char *)&this->document_);
    AVar3 = Value::size(value);
    if (0 < (int)AVar3) {
      index = 0;
      do {
        if (index != 0) {
          std::__cxx11::string::append((char *)&this->document_);
        }
        pVVar5 = Value::operator[](value,index);
        writeValue(this,pVVar5);
        index = index + 1;
      } while (AVar3 != index);
    }
LAB_001125ff:
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    psVar1 = &this->document_;
    std::__cxx11::string::append((char *)psVar1);
    pcVar6 = extraout_RDX;
    pbVar7 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (pbVar7 != local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::append((char *)psVar1);
          pcVar6 = extraout_RDX_00;
        }
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(pbVar7->_M_dataplus)._M_p,pcVar6);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)psVar1);
        pVVar5 = Value::operator[](value,(pbVar7->_M_dataplus)._M_p);
        writeValue(this,pVVar5);
        pbVar7 = pbVar7 + 1;
        pcVar6 = extraout_RDX_01;
      } while (pbVar7 != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::append((char *)psVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_00112378_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00112530:
    operator_delete(local_68._M_dataplus._M_p);
  }
switchD_00112378_default:
  return;
}

Assistant:

ValueType Value::type() const { return type_; }